

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O1

idx_t __thiscall duckdb::IEJoinGlobalSourceState::MaxThreads(IEJoinGlobalSourceState *this)

{
  pointer pGVar1;
  const_reference pvVar2;
  pointer pGVar3;
  const_reference pvVar4;
  pointer pSVar5;
  long lVar6;
  long lVar7;
  
  pGVar1 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       sink_state);
  lVar7 = 0;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                         *)(pGVar1 + 1),0);
  pGVar3 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator->(pvVar2);
  if ((pGVar3->global_sort_state).sorted_blocks.
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pGVar3->global_sort_state).sorted_blocks.
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
             ::operator[](&(pGVar3->global_sort_state).sorted_blocks,0);
    pSVar5 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
             operator->(pvVar4);
    lVar7 = (long)(pSVar5->radix_sorting_data).
                  super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pSVar5->radix_sorting_data).
                  super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3;
  }
  pvVar2 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                         *)(pGVar1 + 1),1);
  pGVar3 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator->(pvVar2);
  if ((pGVar3->global_sort_state).sorted_blocks.
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pGVar3->global_sort_state).sorted_blocks.
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar6 = 0;
  }
  else {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
             ::operator[](&(pGVar3->global_sort_state).sorted_blocks,0);
    pSVar5 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
             operator->(pvVar4);
    lVar6 = (long)(pSVar5->radix_sorting_data).
                  super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pSVar5->radix_sorting_data).
                  super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3;
  }
  return lVar6 * lVar7;
}

Assistant:

idx_t MaxThreads() override {
		// We can't leverage any more threads than block pairs.
		const auto &sink_state = (op.sink_state->Cast<IEJoinGlobalState>());
		return sink_state.tables[0]->BlockCount() * sink_state.tables[1]->BlockCount();
	}